

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

bool duckdb::TryCastCInternal<unsigned_long,bool,duckdb::TryCast>
               (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  undefined8 in_RAX;
  bool result_value;
  bool local_1;
  
  local_1 = SUB81((ulong)in_RAX >> 0x38,0);
  bVar1 = TryCast::Operation<unsigned_long,bool>
                    (*(uint64_t *)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_1,false);
  if (!bVar1) {
    local_1 = false;
  }
  return local_1;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}